

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

void __thiscall tinyxml2::XMLElement::~XMLElement(XMLElement *this)

{
  XMLElement *in_RDI;
  
  ~XMLElement(in_RDI);
  operator_delete(in_RDI,0x78);
  return;
}

Assistant:

XMLElement::~XMLElement()
{
    while( _rootAttribute ) {
        XMLAttribute* next = _rootAttribute->_next;
        DeleteAttribute( _rootAttribute );
        _rootAttribute = next;
    }
}